

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigUtil.c
# Opt level: O3

void Fraig_ManMarkRealFanouts(Fraig_Man_t *p)

{
  Fraig_NodeVec_t *p_00;
  long lVar1;
  Fraig_Node_t **ppFVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  
  p_00 = Fraig_Dfs(p,0);
  if (0 < p_00->nSize) {
    ppFVar2 = p_00->pArray;
    lVar1 = 0;
    do {
      *(uint *)&ppFVar2[lVar1]->field_0x18 = *(uint *)&ppFVar2[lVar1]->field_0x18 & 0xfffff3ff;
      ppFVar2 = p_00->pArray;
      ppFVar2[lVar1]->pData0 = (Fraig_Node_t *)0x0;
      lVar1 = lVar1 + 1;
    } while (lVar1 < p_00->nSize);
    if (0 < p_00->nSize) {
      lVar1 = 0;
      do {
        uVar3 = (ulong)p_00->pArray[lVar1]->p1 & 0xfffffffffffffffe;
        if (uVar3 != 0) {
          uVar5 = (*(uint *)(uVar3 + 0x18) >> 10) + 1 & 3;
          uVar4 = *(uint *)(uVar3 + 0x18) & 0xfffff3ff;
          *(uint *)(uVar3 + 0x18) = uVar5 << 10 | uVar4;
          if (uVar5 == 3) {
            *(uint *)(uVar3 + 0x18) = uVar4 | 0x800;
          }
        }
        uVar3 = (ulong)p_00->pArray[lVar1]->p2 & 0xfffffffffffffffe;
        if (uVar3 != 0) {
          uVar5 = (*(uint *)(uVar3 + 0x18) >> 10) + 1 & 3;
          uVar4 = *(uint *)(uVar3 + 0x18) & 0xfffff3ff;
          *(uint *)(uVar3 + 0x18) = uVar5 << 10 | uVar4;
          if (uVar5 == 3) {
            *(uint *)(uVar3 + 0x18) = uVar4 | 0x800;
          }
        }
        lVar1 = lVar1 + 1;
      } while (lVar1 < p_00->nSize);
    }
  }
  Fraig_NodeVecFree(p_00);
  return;
}

Assistant:

void Fraig_ManMarkRealFanouts( Fraig_Man_t * p )
{
    Fraig_NodeVec_t * vNodes;
    Fraig_Node_t * pNodeR;
    int i;
    // collect the nodes reachable
    vNodes = Fraig_Dfs( p, 0 );
    // clean the fanouts field
    for ( i = 0; i < vNodes->nSize; i++ )
    {
        vNodes->pArray[i]->nFanouts = 0;
        vNodes->pArray[i]->pData0 = NULL;
    }
    // mark reachable nodes by setting the two-bit counter pNode->nFans
    for ( i = 0; i < vNodes->nSize; i++ )
    {
        pNodeR = Fraig_Regular(vNodes->pArray[i]->p1);
        if ( pNodeR && ++pNodeR->nFanouts == 3 )
            pNodeR->nFanouts = 2;
        pNodeR = Fraig_Regular(vNodes->pArray[i]->p2);
        if ( pNodeR && ++pNodeR->nFanouts == 3 )
            pNodeR->nFanouts = 2;
    }
    Fraig_NodeVecFree( vNodes );
}